

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelExporter.cpp
# Opt level: O2

bool __thiscall
iDynTree::ModelExporter::exportModelToFile(ModelExporter *this,string *filename,string *filetype)

{
  _Head_base<0UL,_iDynTree::ModelExporter::Pimpl_*,_false> model;
  bool bVar1;
  ostream *poVar2;
  stringstream error_msg;
  char *local_220 [4];
  ModelExporterOptions local_200;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  bVar1 = std::operator!=(filetype,"urdf");
  if (bVar1) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar2 = std::operator<<(local_190,"Filetype ");
    poVar2 = std::operator<<(poVar2,(string *)filetype);
    std::operator<<(poVar2," not supported. Only urdf format is currently supported.");
    std::__cxx11::stringbuf::str();
    iDynTree::reportError("ModelExporter","exportModelToFile",local_220[0]);
    std::__cxx11::string::~string((string *)local_220);
    std::__cxx11::stringstream::~stringstream(local_1a0);
    bVar1 = false;
  }
  else {
    model._M_head_impl =
         (this->m_pimpl)._M_t.
         super___uniq_ptr_impl<iDynTree::ModelExporter::Pimpl,_std::default_delete<iDynTree::ModelExporter::Pimpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_iDynTree::ModelExporter::Pimpl_*,_std::default_delete<iDynTree::ModelExporter::Pimpl>_>
         .super__Head_base<0UL,_iDynTree::ModelExporter::Pimpl_*,_false>._M_head_impl;
    ModelExporterOptions::ModelExporterOptions(&local_200,&(model._M_head_impl)->m_options);
    bVar1 = URDFFromModel(&(model._M_head_impl)->m_model,filename,&local_200);
    ModelExporterOptions::~ModelExporterOptions(&local_200);
  }
  return bVar1;
}

Assistant:

bool ModelExporter::exportModelToFile(const std::string & filename, const std::string filetype)
{
    if (filetype != "urdf") {
        std::stringstream error_msg;
        error_msg << "Filetype " << filetype << " not supported. Only urdf format is currently supported.";
        reportError("ModelExporter", "exportModelToFile", error_msg.str().c_str());
        return false;
    }

    return URDFFromModel(m_pimpl->m_model, filename, m_pimpl->m_options);
}